

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::redirectPendingData(Private *this)

{
  code *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  int local_20e4;
  ssize i_1;
  char buffer_1 [4096];
  ssize i;
  char buffer [4096];
  undefined1 local_b0 [8];
  timeval tv;
  fd_set *__arr;
  undefined1 local_90 [4];
  uint __i;
  fd_set fdr;
  Private *this_local;
  
  fdr.fds_bits[0xf] = (__fd_mask)this;
  do {
    do {
      tv.tv_usec = (__suseconds_t)local_90;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(tv.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
      }
      lVar5 = (long)(this->stdoutRead / 0x40);
      *(ulong *)(local_90 + lVar5 * 8) =
           1L << ((byte)((long)this->stdoutRead % 0x40) & 0x3f) | *(ulong *)(local_90 + lVar5 * 8);
      lVar5 = (long)(this->stderrRead / 0x40);
      *(ulong *)(local_90 + lVar5 * 8) =
           1L << ((byte)((long)this->stderrRead % 0x40) & 0x3f) | *(ulong *)(local_90 + lVar5 * 8);
      memset(local_b0,0,0x10);
      if (this->stderrRead < this->stdoutRead) {
        local_20e4 = this->stdoutRead;
      }
      else {
        local_20e4 = this->stderrRead;
      }
      iVar2 = select(local_20e4 + 1,(fd_set *)local_90,(fd_set *)0x0,(fd_set *)0x0,
                     (timeval *)local_b0);
      if (iVar2 == -1) {
        iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x353,"false");
        if (iVar2 == 0) {
          return;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      if (iVar2 == 0) {
        return;
      }
      if ((*(ulong *)(local_90 + (long)(this->stdoutRead / 0x40) * 8) &
          1L << ((byte)((long)this->stdoutRead % 0x40) & 0x3f)) != 0) {
        sVar3 = read(this->stdoutRead,&i,0x1000);
        if ((sVar3 == 0xffffffffffffffff) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                  ,0x35c,"i != -1"), iVar2 != 0)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        sVar4 = write(originalStdout,&i,sVar3);
        if ((sVar4 != sVar3) &&
           (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                  ,0x35d,"write(originalStdout, buffer, i) == i"), iVar2 != 0)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    } while ((*(ulong *)(local_90 + (long)(this->stderrRead / 0x40) * 8) &
             1L << ((byte)((long)this->stderrRead % 0x40) & 0x3f)) == 0);
    sVar3 = read(this->stderrRead,&i_1,0x1000);
    if ((sVar3 == 0xffffffffffffffff) &&
       (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x363,"i != -1"), iVar2 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    sVar4 = write(this->originalStderr,&i_1,sVar3);
  } while ((sVar4 == sVar3) ||
          (iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                                 ,0x364,"write(originalStderr, buffer, i) == i"), iVar2 == 0));
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void redirectPendingData()
  {
#ifdef _MSC_VER
    DWORD read;
    while(GetOverlappedResult(hStdOutRead, &outOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdOutRead, stdoutBuffer, sizeof(stdoutBuffer), &read, &outOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
    while(GetOverlappedResult(hStdErrRead, &errOverlapped, &read, FALSE))
    {
        DWORD written;
        VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
        ASSERT(written == read / sizeof(char));
        while(ReadFile(hStdErrRead, stderrBuffer, sizeof(stderrBuffer), &read, &errOverlapped))
        {
          VERIFY(WriteConsole(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
          ASSERT(written == read / sizeof(char));
        }
    }
#else
    for(;;)
    {
      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      timeval tv = {0, 0};
      switch(select((stdoutRead > stderrRead ? stdoutRead : stderrRead) + 1, &fdr, 0, 0, &tv))
      {
      case -1:
        ASSERT(false);
        return;
      case 0:
        break;
      default: // todo: redirect data character by character to ensure utf8 and escaped sequences are valid?
        if(FD_ISSET(stdoutRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stdoutRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStdout, buffer, i) == i);
        }
        if(FD_ISSET(stderrRead, &fdr))
        {
          char buffer[4096];
          ssize i = read(stderrRead, buffer, sizeof(buffer));
          VERIFY(i != -1);
          VERIFY(write(originalStderr, buffer, i) == i);
        }
        continue;
      }
      break;
    }
#endif
  }